

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::PrivateToLocalPass::Process(PrivateToLocalPass *this)

{
  Module *pMVar1;
  Instruction *pIVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  uint32_t uVar6;
  FeatureManager *pFVar7;
  Function *pFVar8;
  size_type sVar9;
  Operand *__x;
  long lVar10;
  Status SVar11;
  uint index;
  iterator __end2;
  iterator __begin2;
  pointer ppVar12;
  Instruction *entry;
  Instruction **ppIVar13;
  Instruction *inst;
  uint32_t local_bc;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
  variables_to_move;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  localized_variables;
  
  pFVar7 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar5 = EnumSet<spv::Capability>::contains(&pFVar7->capabilities_,Addresses);
  if (bVar5) {
    SVar11 = SuccessWithoutChange;
  }
  else {
    variables_to_move.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    variables_to_move.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    variables_to_move.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    localized_variables._M_h._M_buckets = &localized_variables._M_h._M_single_bucket;
    localized_variables._M_h._M_bucket_count = 1;
    localized_variables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    localized_variables._M_h._M_element_count = 0;
    localized_variables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    localized_variables._M_h._M_rehash_policy._M_next_resize = 0;
    localized_variables._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    ppIVar13 = (Instruction **)
               ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    while (ppVar4 = variables_to_move.
                    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          ppVar3 = variables_to_move.
                   super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, pIVar2 = *ppIVar13,
          pIVar2 != (Instruction *)
                    ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction>
                    + 8U)) {
      if (pIVar2->opcode_ == OpVariable) {
        uVar6 = Instruction::GetSingleWordInOperand(pIVar2,0);
        if (uVar6 == 6) {
          pFVar8 = FindLocalFunction(this,pIVar2);
          if (pFVar8 != (Function *)0x0) {
            new_operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar2;
            new_operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)pFVar8;
            std::
            vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>>
            ::emplace_back<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>
                      ((vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>>
                        *)&variables_to_move,
                       (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)
                       &new_operands);
          }
        }
      }
      ppIVar13 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    for (ppVar12 = variables_to_move.
                   super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar4;
        ppVar12 = ppVar12 + 1) {
      pIVar2 = ppVar12->first;
      bVar5 = MoveVariable(this,pIVar2,ppVar12->second);
      if (!bVar5) {
        SVar11 = Failure;
        goto LAB_004845a1;
      }
      uVar6 = Instruction::result_id(pIVar2);
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(new_operands.
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar6);
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&localized_variables,(value_type *)&new_operands);
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    if (0x103ff < (pMVar1->header_).version) {
      ppIVar13 = (Instruction **)
                 ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      while (pIVar2 = *ppIVar13,
            pIVar2 != (Instruction *)
                      ((long)&(pMVar1->entry_points_).
                              super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        index = 0;
        while( true ) {
          uVar6 = Instruction::NumInOperands(pIVar2);
          if (uVar6 <= index) break;
          if (index < 3) {
LAB_00484526:
            __x = Instruction::GetInOperand(pIVar2,index);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      (&new_operands,__x);
          }
          else {
            local_bc = Instruction::GetSingleWordInOperand(pIVar2,index);
            sVar9 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&localized_variables._M_h,&local_bc);
            if (sVar9 == 0) goto LAB_00484526;
          }
          index = index + 1;
        }
        lVar10 = (long)new_operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)new_operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = Instruction::NumInOperands(pIVar2);
        if (lVar10 / 0x30 != (ulong)uVar6) {
          Instruction::SetInOperands(pIVar2,&new_operands);
          IRContext::AnalyzeUses((this->super_Pass).context_,pIVar2);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&new_operands);
        ppIVar13 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
    }
    SVar11 = ppVar3 == ppVar4 | SuccessWithChange;
LAB_004845a1:
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&localized_variables._M_h);
    std::
    _Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
    ::~_Vector_base(&variables_to_move.
                     super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
                   );
  }
  return SVar11;
}

Assistant:

Pass::Status PrivateToLocalPass::Process() {
  bool modified = false;

  // Private variables require the shader capability.  If this is not a shader,
  // there is no work to do.
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  std::vector<std::pair<Instruction*, Function*>> variables_to_move;
  std::unordered_set<uint32_t> localized_variables;
  for (auto& inst : context()->types_values()) {
    if (inst.opcode() != spv::Op::OpVariable) {
      continue;
    }

    if (spv::StorageClass(inst.GetSingleWordInOperand(
            kVariableStorageClassInIdx)) != spv::StorageClass::Private) {
      continue;
    }

    Function* target_function = FindLocalFunction(inst);
    if (target_function != nullptr) {
      variables_to_move.push_back({&inst, target_function});
    }
  }

  modified = !variables_to_move.empty();
  for (auto p : variables_to_move) {
    if (!MoveVariable(p.first, p.second)) {
      return Status::Failure;
    }
    localized_variables.insert(p.first->result_id());
  }

  if (get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 4)) {
    // In SPIR-V 1.4 and later entry points must list private storage class
    // variables that are statically used by the entry point. Go through the
    // entry points and remove any references to variables that were localized.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        // Execution model, function id and name are always kept.
        if (i < 3 ||
            !localized_variables.count(entry.GetSingleWordInOperand(i))) {
          new_operands.push_back(entry.GetInOperand(i));
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        context()->AnalyzeUses(&entry);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}